

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O1

void __thiscall TPZGeoMesh::PrintTopologicalInfo(TPZGeoMesh *this,ostream *out)

{
  long lVar1;
  ostream *poVar2;
  TPZGeoNode *this_00;
  TPZGeoEl **ppTVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"TITLE-> ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->fName)._M_dataplus._M_p,(this->fName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of nodes       = ",0x18);
  poVar2 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of elements    = ",0x18);
  poVar2 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\tGeometric Node Information:\n",0x1e);
  lVar1 = (this->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                          (&(this->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,lVar4);
      TPZGeoNode::Print(this_00,out);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\n\tGeometric Element Information:\n",0x21);
  lVar1 = (this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar4);
      if (*ppTVar3 != (TPZGeoEl *)0x0) {
        ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (&(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar4);
        (**(code **)(*(long *)*ppTVar3 + 0x1a8))(*ppTVar3,out);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return;
}

Assistant:

void TPZGeoMesh::PrintTopologicalInfo(std::ostream & out) const
{
	out << "TITLE-> " << fName << "\n";
	out << "Number of nodes       = " << fNodeVec.NElements() << "\n";
	out << "Number of elements    = " << fElementVec.NElements()-fElementVec.NFreeElements() << "\n";
	
	out << "\n\tGeometric Node Information:\n";
	int64_t i;
	int64_t nnodes = fNodeVec.NElements();
	for(i=0; i<nnodes; i++)
	{
		fNodeVec[i].Print(out);
	}
	out << "\n\tGeometric Element Information:\n";
	int64_t nelem = fElementVec.NElements();
	for(i=0; i<nelem; i++)
	{
		if(fElementVec[i]) fElementVec[i]->PrintTopologicalInfo(out);
		out << "\n";
	}
}